

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O0

int __thiscall
CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::Get
          (CSHRSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,int n,
          SHMPTR *shridpObjs)

{
  int iVar1;
  _USHRSynchCacheStackNode *p_Var2;
  bool local_5a;
  int local_50;
  int local_4c;
  int local_48;
  int k;
  int j;
  int i;
  USHRSynchCacheStackNode *pNode;
  void *pvObjRaw;
  SHMPTR shridObj;
  SHMPTR *shridpObjs_local;
  CPalThread *pCStack_18;
  int n_local;
  CPalThread *pthrCurrent_local;
  CSHRSynchCache<CorUnix::_WaitingThreadsListNode> *this_local;
  
  pNode = (USHRSynchCacheStackNode *)0x0;
  k = 0;
  shridObj = (SHMPTR)shridpObjs;
  shridpObjs_local._4_4_ = n;
  pCStack_18 = pthrCurrent;
  pthrCurrent_local = (CPalThread *)this;
  Lock(this,pthrCurrent);
  for (_j = Volatile::operator_cast_to__USHRSynchCacheStackNode_((Volatile *)this);
      _j != (_USHRSynchCacheStackNode *)0x0 && k < shridpObjs_local._4_4_; _j = (_j->pointers).pNext
      ) {
    *(SHMPTR *)(shridObj + (long)k * 8) = (_j->pointers).shrid;
    pNode = _j;
    k = k + 1;
  }
  Volatile<CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::_USHRSynchCacheStackNode_*>::
  operator=(&this->m_pHead,_j);
  Volatile<int>::operator-=(&this->m_iDepth,k);
  p_Var2 = Volatile::operator_cast_to__USHRSynchCacheStackNode_((Volatile *)this);
  local_5a = false;
  if (p_Var2 == (_USHRSynchCacheStackNode *)0x0) {
    local_50 = 0;
    local_5a = Volatile<int>::operator!=(&this->m_iDepth,&local_50);
  }
  if (local_5a != false) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  iVar1 = Volatile::operator_cast_to_int((Volatile *)&this->m_iDepth);
  if (iVar1 == 0) {
    for (local_4c = 0; local_4c < (this->m_iMaxDepth / 10 - shridpObjs_local._4_4_) + k;
        local_4c = local_4c + 1) {
      pvObjRaw = (void *)SHMalloc(0x40);
      if (pvObjRaw == (void *)0x0) {
        Flush(this,pCStack_18,true);
        break;
      }
      _j = (_USHRSynchCacheStackNode *)SHMPtrToPtr((SHMPTR)pvObjRaw);
      memset(_j,0,0x40);
      (_j->pointers).shrid = (SHMPTR)pvObjRaw;
      p_Var2 = Volatile::operator_cast_to__USHRSynchCacheStackNode_((Volatile *)this);
      (_j->pointers).pNext = p_Var2;
      Volatile<CorUnix::CSHRSynchCache<CorUnix::_WaitingThreadsListNode>::_USHRSynchCacheStackNode_*>
      ::operator=(&this->m_pHead,_j);
      Volatile<int>::operator++(&this->m_iDepth,0);
    }
  }
  Unlock(this,pCStack_18);
  local_48 = k;
  while ((local_48 < shridpObjs_local._4_4_ &&
         (pvObjRaw = (void *)SHMalloc(0x40), pvObjRaw != (void *)0x0))) {
    pNode = (USHRSynchCacheStackNode *)SHMPtrToPtr((SHMPTR)pvObjRaw);
    memset(pNode,0,0x40);
    *(void **)(shridObj + (long)local_48 * 8) = pvObjRaw;
    local_48 = local_48 + 1;
  }
  for (k = 0; k < local_48; k = k + 1) {
    pNode = (USHRSynchCacheStackNode *)SHMPtrToPtr(*(SHMPTR *)(shridObj + (long)k * 8));
  }
  return local_48;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, SharedID * shridpObjs)
        {
            SharedID shridObj;
            void * pvObjRaw = NULL;
            USHRSynchCacheStackNode * pNode;
            int i = 0, j, k;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {            
                shridpObjs[i] = pNode->pointers.shrid;
                pvObjRaw = (void *)pNode;
                pNode = pNode->pointers.pNext;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                    // Can't use ASSERT here, since this is header
                    // (see comment above)
                    fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                    DebugBreak();
            }
#endif // _DEBUG

            if (0 == m_iDepth)
            {
                for (k=0; k<m_iMaxDepth/PreAllocFactor-n+i; k++)
                {
                    shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                    if (NULLSharedID == shridObj)
                    {
                        Flush(pthrCurrent, true);
                        break;
                    }
                    pNode = SharedIDToTypePointer(USHRSynchCacheStackNode, shridObj);
#ifdef _DEBUG
                    memset(reinterpret_cast<void*>(pNode), 0, sizeof(USHRSynchCacheStackNode));
#endif
                    pNode->pointers.shrid = shridObj;
                    pNode->pointers.pNext = m_pHead;
                    m_pHead = pNode;
                    m_iDepth++;
                }
            }

            Unlock(pthrCurrent);       

            for (j=i;j<n;j++)
            {
                shridObj = RawSharedObjectAlloc(sizeof(USHRSynchCacheStackNode), DefaultSharedPool);
                if (NULLSharedID == shridObj)
                    break;
#ifdef _DEBUG
                pvObjRaw = SharedIDToPointer(shridObj);                
                memset(pvObjRaw, 0, sizeof(USHRSynchCacheStackNode));                
#endif
                shridpObjs[j] = shridObj;
            }
            
            for (i=0;i<j;i++)
            {           
                pvObjRaw = SharedIDToPointer(shridpObjs[i]);                
                new (pvObjRaw) T;            
            }
            
            return j;
        }